

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Forward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  int i;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  value_type vVar8;
  Fad<double> sum;
  Fad<double> pivot;
  Fad<double> local_d8;
  TPZMatrix<Fad<double>_> *local_b8;
  FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_> local_b0;
  Fad<double> local_a0;
  Fad<double> local_80;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_60;
  Fad<double> local_50;
  
  lVar7 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar7 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar3 = 1;
    if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
      lVar7 = 0;
      local_b8 = this;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar7,lVar7);
        if (0 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol) {
          lVar6 = 0;
          do {
            local_a0.val_ = 0.0;
            local_a0.dx_.num_elts = 0;
            local_a0.dx_.ptr_to_data = (double *)0x0;
            local_a0.defaultVal = 0.0;
            if (lVar7 != 0) {
              lVar4 = 0;
              do {
                (*(local_b8->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_d8,local_b8,lVar7,lVar4);
                (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(&local_80,B,lVar4,lVar6);
                local_b0.left_ = (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&local_d8;
                local_b0.right_ = &local_80;
                Fad<double>::operator+=
                          (&local_a0,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_b0)
                ;
                Fad<double>::~Fad(&local_80);
                Fad<double>::~Fad(&local_d8);
                lVar4 = lVar4 + 1;
              } while (lVar7 != lVar4);
            }
            (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(&local_80,B,lVar7,lVar6);
            local_60.fadexpr_.right_ = &local_a0;
            local_b0.left_ = &local_60;
            local_b0.right_ = &local_50;
            local_d8.val_ = (local_80.val_ - local_a0.val_) / local_50.val_;
            uVar1 = local_a0.dx_.num_elts;
            if (local_a0.dx_.num_elts < local_80.dx_.num_elts) {
              uVar1 = local_80.dx_.num_elts;
            }
            if ((int)uVar1 <= local_50.dx_.num_elts) {
              uVar1 = local_50.dx_.num_elts;
            }
            local_d8.dx_.num_elts = 0;
            local_d8.dx_.ptr_to_data = (double *)0x0;
            local_60.fadexpr_.left_ = &local_80;
            if ((int)uVar1 < 1) {
              local_d8.defaultVal = 0.0;
            }
            else {
              local_d8.dx_.num_elts = uVar1;
              local_d8.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar1 * 8);
              local_d8.defaultVal = 0.0;
              uVar5 = 0;
              do {
                vVar8 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                        ::dx(&local_b0,(int)uVar5);
                local_d8.dx_.ptr_to_data[uVar5] = vVar8;
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
            (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar7,lVar6,&local_d8);
            Fad<double>::~Fad(&local_d8);
            Fad<double>::~Fad(&local_80);
            Fad<double>::~Fad(&local_a0);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
        }
        Fad<double>::~Fad(&local_50);
        this = local_b8;
        lVar7 = lVar7 + 1;
        iVar2 = (*(local_b8->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(local_b8);
      } while (lVar7 < CONCAT44(extraout_var_01,iVar2));
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}